

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

void __thiscall sentencepiece::NBestSentencePieceText::Clear(NBestSentencePieceText *this)

{
  long in_RDI;
  uint32 cached_has_bits;
  
  google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::Clear
            ((RepeatedPtrField<sentencepiece::SentencePieceText> *)0x450563);
  if (((uint)((InternalMetadata *)(in_RDI + 8))->ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
              ((InternalMetadata *)(in_RDI + 8));
  }
  return;
}

Assistant:

void NBestSentencePieceText::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.NBestSentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  nbests_.Clear();
  _internal_metadata_.Clear<std::string>();
}